

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidySaveString(TidyDoc tdoc,tmbstr buffer,uint *buflen)

{
  int iVar1;
  TidyDocImpl *doc;
  uint *buflen_local;
  tmbstr buffer_local;
  TidyDoc tdoc_local;
  
  iVar1 = tidyDocSaveString((TidyDocImpl *)tdoc,buffer,buflen);
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveString( TidyDoc tdoc, tmbstr buffer, uint* buflen )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveString( doc, buffer, buflen );
}